

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vraster.cpp
# Opt level: O0

void __thiscall RleTaskScheduler::RleTaskScheduler(RleTaskScheduler *this)

{
  uint uVar1;
  allocator_type *__a;
  type *in_RDI;
  uint n;
  __integral_type_conflict __i;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint local_10;
  
  uVar1 = std::thread::hardware_concurrency();
  in_RDI->n = uVar1;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)0x132e78);
  __i = (__integral_type_conflict)((ulong)(in_RDI + 2) >> 0x20);
  __a = (allocator_type *)(ulong)in_RDI->n;
  std::allocator<TaskQueue<std::shared_ptr<VRleTask>_>_>::allocator
            ((allocator<TaskQueue<std::shared_ptr<VRleTask>_>_> *)0x132e99);
  std::
  vector<TaskQueue<std::shared_ptr<VRleTask>_>,_std::allocator<TaskQueue<std::shared_ptr<VRleTask>_>_>_>
  ::vector((vector<TaskQueue<std::shared_ptr<VRleTask>_>,_std::allocator<TaskQueue<std::shared_ptr<VRleTask>_>_>_>
            *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),(size_type)in_RDI,__a);
  std::allocator<TaskQueue<std::shared_ptr<VRleTask>_>_>::~allocator
            ((allocator<TaskQueue<std::shared_ptr<VRleTask>_>_> *)0x132eb6);
  std::atomic<unsigned_int>::atomic((atomic<unsigned_int> *)__a,__i);
  for (local_10 = 0; local_10 != in_RDI->n; local_10 = local_10 + 1) {
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<RleTaskScheduler::RleTaskScheduler()::_lambda()_1_>
              ((vector<std::thread,_std::allocator<std::thread>_> *)
               CONCAT44(in_stack_ffffffffffffffe4,local_10),in_RDI);
  }
  IsRunning = true;
  return;
}

Assistant:

RleTaskScheduler()
    {
        for (unsigned n = 0; n != _count; ++n) {
            _threads.emplace_back([&, n] { run(n); });
        }

        IsRunning = true;
    }